

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FixF0
               (double *power_spectrum,double *numerator_i,int fft_size,double fs,double current_f0,
               int number_of_harmonics,double *refined_f0,double *score)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar8;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int i_1;
  double numerator;
  double denominator;
  int i;
  int index;
  double *instantaneous_frequency_list;
  double *amplitude_list;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_58;
  
  dVar3 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ECX;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ECX;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar5);
  for (local_58 = 0; local_58 < in_ECX; local_58 = local_58 + 1) {
    iVar4 = matlab_round(((dVar3 * (double)in_EDX) / in_XMM0_Qa) * (double)(local_58 + 1));
    dVar8 = *(double *)(in_RDI + (long)iVar4 * 8);
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      local_78 = ((double)iVar4 * in_XMM0_Qa) / (double)in_EDX +
                 (((*(double *)(in_RSI + (long)iVar4 * 8) / *(double *)(in_RDI + (long)iVar4 * 8)) *
                  in_XMM0_Qa) / 2.0) / 3.141592653589793;
    }
    else {
      local_78 = 0.0;
    }
    *(double *)((long)pvVar7 + (long)local_58 * 8) = local_78;
    dVar8 = sqrt(*(double *)(in_RDI + (long)iVar4 * 8));
    *(double *)((long)pvVar6 + (long)local_58 * 8) = dVar8;
  }
  local_60 = 0.0;
  local_68 = 0.0;
  *in_R9 = 0.0;
  for (local_6c = 0; local_6c < in_ECX; local_6c = local_6c + 1) {
    local_68 = *(double *)((long)pvVar6 + (long)local_6c * 8) *
               *(double *)((long)pvVar7 + (long)local_6c * 8) + local_68;
    local_60 = *(double *)((long)pvVar6 + (long)local_6c * 8) * ((double)local_6c + 1.0) + local_60;
    *in_R9 = ABS((*(double *)((long)pvVar7 + (long)local_6c * 8) / ((double)local_6c + 1.0) - dVar3)
                 / dVar3) + *in_R9;
  }
  *in_R8 = local_68 / (local_60 + 1e-12);
  *in_R9 = 1.0 / (*in_R9 / (double)in_ECX + 1e-12);
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  return;
}

Assistant:

static void FixF0(const double *power_spectrum, const double *numerator_i,
    int fft_size, double fs, double current_f0, int number_of_harmonics,
    double *refined_f0, double *score) {
  double *amplitude_list = new double[number_of_harmonics];
  double *instantaneous_frequency_list = new double[number_of_harmonics];

  int index;
  for (int i = 0; i < number_of_harmonics; ++i) {
    index = matlab_round(current_f0 * fft_size / fs * (i + 1));
    instantaneous_frequency_list[i] = power_spectrum[index] == 0.0 ? 0.0 :
      static_cast<double>(index) * fs / fft_size +
      numerator_i[index] / power_spectrum[index] * fs / 2.0 / world::kPi;
    amplitude_list[i] = sqrt(power_spectrum[index]);
  }
  double denominator = 0.0;
  double numerator = 0.0;
  *score = 0.0;
  for (int i = 0; i < number_of_harmonics; ++i) {
    numerator += amplitude_list[i] * instantaneous_frequency_list[i];
    denominator += amplitude_list[i] * (i + 1.0);
    *score += fabs((instantaneous_frequency_list[i] / (i + 1.0) - current_f0) /
      current_f0);
  }

  *refined_f0 = numerator / (denominator + world::kMySafeGuardMinimum);
  *score = 1.0 / (*score / number_of_harmonics + world::kMySafeGuardMinimum);

  delete[] amplitude_list;
  delete[] instantaneous_frequency_list;
}